

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O1

psa_status_t psa_validate_optional_attributes(psa_key_slot_t *slot,psa_key_attributes_t *attributes)

{
  psa_key_type_t pVar1;
  psa_key_bits_t pVar2;
  int ret;
  psa_status_t pVar3;
  int iVar4;
  mbedtls_mpi required;
  mbedtls_mpi actual;
  mbedtls_mpi local_50;
  mbedtls_mpi local_38;
  
  pVar1 = (attributes->core).type;
  if ((pVar1 != 0) && (pVar1 != (slot->attr).type)) {
    return -0x87;
  }
  if (attributes->domain_parameters_size != 0) {
    if (((slot->attr).type & 0xcfff) != 0x4001) {
      return -0x87;
    }
    mbedtls_mpi_init(&local_38);
    mbedtls_mpi_init(&local_50);
    ret = mbedtls_rsa_export((slot->data).rsa,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,
                             (mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,&local_38);
    if ((ret == 0) &&
       (ret = mbedtls_mpi_read_binary
                        (&local_50,(uchar *)attributes->domain_parameters,
                         attributes->domain_parameters_size), ret == 0)) {
      iVar4 = mbedtls_mpi_cmp_mpi(&local_38,&local_50);
      ret = -0x4080;
      if (iVar4 == 0) {
        ret = 0;
      }
    }
    mbedtls_mpi_free(&local_38);
    mbedtls_mpi_free(&local_50);
    if (ret != 0) {
      pVar3 = mbedtls_to_psa_error(ret);
      return pVar3;
    }
  }
  pVar2 = (attributes->core).bits;
  if ((pVar2 == 0) || (pVar3 = -0x87, pVar2 == (slot->attr).bits)) {
    pVar3 = 0;
  }
  return pVar3;
}

Assistant:

static psa_status_t psa_validate_optional_attributes(
    const psa_key_slot_t *slot,
    const psa_key_attributes_t *attributes )
{
    if( attributes->core.type != 0 )
    {
        if( attributes->core.type != slot->attr.type )
            return( PSA_ERROR_INVALID_ARGUMENT );
    }

    if( attributes->domain_parameters_size != 0 )
    {
#if defined(MBEDTLS_RSA_C)
        if( PSA_KEY_TYPE_IS_RSA( slot->attr.type ) )
        {
            mbedtls_mpi actual, required;
            int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
            mbedtls_mpi_init( &actual );
            mbedtls_mpi_init( &required );
            ret = mbedtls_rsa_export( slot->data.rsa,
                                      NULL, NULL, NULL, NULL, &actual );
            if( ret != 0 )
                goto rsa_exit;
            ret = mbedtls_mpi_read_binary( &required,
                                           attributes->domain_parameters,
                                           attributes->domain_parameters_size );
            if( ret != 0 )
                goto rsa_exit;
            if( mbedtls_mpi_cmp_mpi( &actual, &required ) != 0 )
                ret = MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
        rsa_exit:
            mbedtls_mpi_free( &actual );
            mbedtls_mpi_free( &required );
            if( ret != 0)
                return( mbedtls_to_psa_error( ret ) );
        }
        else
#endif
        {
            return( PSA_ERROR_INVALID_ARGUMENT );
        }
    }

    if( attributes->core.bits != 0 )
    {
        if( attributes->core.bits != slot->attr.bits )
            return( PSA_ERROR_INVALID_ARGUMENT );
    }

    return( PSA_SUCCESS );
}